

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.c
# Opt level: O0

void run_merge_count_task(work_item *work_item,size_t thread_id)

{
  work_item *pwVar1;
  size_t j;
  size_t n;
  size_t i;
  merge_count_task *merge_count_task;
  size_t thread_id_local;
  work_item *work_item_local;
  
  work_item[3].work_fn = (work_fn_t)0x0;
  work_item[2].next = (work_item *)0x0;
  pwVar1 = work_item[1].next;
  for (n = (size_t)work_item[1].work_fn; n < pwVar1; n = n + 1) {
    if (*(size_t *)(work_item[2].work_fn + *(ulong *)(work_item[2].work_fn + n * 8) * 8) == n) {
      work_item[2].next =
           (work_item *)
           ((long)&(work_item[2].next)->work_fn +
           (long)(int)(uint)(n < *(ulong *)(work_item[2].work_fn + n * 8)));
    }
    else {
      work_item[3].work_fn = work_item[3].work_fn + 1;
    }
  }
  return;
}

Assistant:

static void run_merge_count_task(struct work_item* work_item, size_t thread_id) {
    IGNORE(thread_id);
    struct merge_count_task* merge_count_task = (void*)work_item;
    merge_count_task->merged_count = merge_count_task->unmerged_count = 0;
    for (size_t i = merge_count_task->begin, n = merge_count_task->end; i < n; ++i) {
        size_t j = merge_count_task->neighbors[i];
        if (merge_count_task->neighbors[j] == i)
            merge_count_task->merged_count += i < j ? 1 : 0;
        else
            merge_count_task->unmerged_count++;
    }
}